

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cc
# Opt level: O2

bool __thiscall Worker::start(Worker *this)

{
  int iVar1;
  Worker *local_38;
  thread local_30;
  code *local_28;
  undefined8 local_20;
  
  iVar1 = this->socketfd_;
  if (iVar1 != -1) {
    this->alive_ = true;
    local_28 = work;
    local_20 = 0;
    local_38 = this;
    std::thread::thread<void(Worker::*)(),Worker*,void>(&local_30,(type *)&local_28,&local_38);
    std::thread::operator=(&this->thread,&local_30);
    std::thread::~thread(&local_30);
  }
  return iVar1 != -1;
}

Assistant:

bool Worker::start()
{
    if (socketfd_ != -1)
    {
        this->alive_ = true;
        this->thread = std::thread(&Worker::work, this);
        return true;
    }

    return false;
}